

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

int __thiscall
QtPrivate::QGenericArrayOps<QDBusConnectionPrivate::ObjectTreeNode>::truncate
          (QGenericArrayOps<QDBusConnectionPrivate::ObjectTreeNode> *this,char *__file,
          __off_t __length)

{
  ObjectTreeNode *pOVar1;
  ObjectTreeNode *in_stack_ffffffffffffffd8;
  
  pOVar1 = QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode>::begin
                     ((QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode> *)0x183611);
  pOVar1 = pOVar1 + (long)__file;
  QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode>::end
            ((QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode> *)pOVar1);
  std::destroy<QDBusConnectionPrivate::ObjectTreeNode*>(pOVar1,in_stack_ffffffffffffffd8);
  (this->super_QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode>).size = (qsizetype)__file;
  return (int)this;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }